

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Vector<float,_2>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Vector<float,_2>_>_>
         *this)

{
  double *pdVar1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  ostringstream *poVar4;
  ostream *poVar5;
  Precision PVar6;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar7;
  Statement *pSVar8;
  ShaderExecutor *pSVar9;
  Variable<tcu::Vector<float,_4>_> *pVVar10;
  pointer pcVar11;
  Variable<tcu::Matrix<float,_4,_2>_> *pVVar12;
  Variable<tcu::Vector<float,_2>_> *pVVar13;
  byte bVar14;
  long lVar15;
  pointer pMVar16;
  pointer pVVar17;
  bool bVar18;
  bool bVar19;
  int iVar20;
  uint uVar21;
  undefined8 uVar22;
  long lVar23;
  IVal *pIVar24;
  IVal *value;
  IVal *value_00;
  long lVar25;
  undefined8 *puVar26;
  long lVar27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  string *psVar29;
  _Base_ptr p_Var30;
  byte bVar31;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Vector<float,_2>_>_>
  *pBVar32;
  FloatFormat *pFVar33;
  TestStatus *pTVar34;
  byte bVar35;
  IVal in2;
  FuncSet funcs;
  IVal in3;
  IVal in1;
  IVal reference0;
  FloatFormat highpFmt;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Vector<float,_2>_>_> outputs;
  Environment env;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  float in_stack_fffffffffffffa48;
  _Alloc_hider _Var36;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Vector<float,_2>_>_>
  *local_590;
  TestLog *local_588;
  long local_580;
  size_t local_578;
  undefined1 local_570 [12];
  uint uStack_564;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_560;
  _Base_ptr local_550;
  double dStack_548;
  string local_510;
  ulong local_4f0;
  TestStatus *local_4e8;
  FloatFormat *local_4e0;
  IVal local_4d8;
  undefined1 local_4a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  double local_488;
  Precision PStack_480;
  undefined4 uStack_47c;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_478;
  undefined4 local_470;
  undefined8 auStack_448 [2];
  ios_base local_438 [8];
  ios_base local_430 [264];
  FloatFormat local_328;
  long local_300;
  long local_2f8;
  long local_2f0;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Vector<float,_2>_>_>
  local_2e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2b8;
  pointer local_288;
  pointer local_280;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  undefined1 local_1a8 [112];
  undefined8 local_138 [33];
  
  bVar35 = 0;
  this_00 = this->m_samplings;
  pFVar33 = &(this->m_caseCtx).floatFormat;
  PVar6 = (this->m_caseCtx).precision;
  sVar7 = (this->m_caseCtx).numRandoms;
  local_4e8 = __return_storage_ptr__;
  iVar20 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_4e0 = pFVar33;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar33,(FloatFormat *)(ulong)PVar6,(Precision)sVar7,(ulong)(iVar20 + 0xdeadbeef),
             (deUint32)in_stack_fffffffffffffa48);
  pVVar17 = local_278.in0.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_578 = (long)local_278.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_278.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Vector<float,_2>_>_>::Outputs
            (&local_2e8,local_578);
  local_328.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_328.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_328.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_328.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_328.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_328.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_328.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_328.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_328._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2b8._M_impl.super__Rb_tree_header._M_header;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2b8._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_588 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_288 = local_2e8.out0.
              super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_280 = local_2e8.out1.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  poVar4 = (ostringstream *)(local_4a8 + 8);
  local_590 = this;
  local_4a8._0_8_ = local_588;
  std::__cxx11::ostringstream::ostringstream(poVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Statement: ",0xb);
  pFVar33 = local_4e0;
  std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  std::ios_base::~ios_base(local_430);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var3 = (_Rb_tree_node_base *)(local_570 + 8);
  stack0xfffffffffffffa98 = (double)((ulong)uStack_564 << 0x20);
  aStack_560._M_allocated_capacity = 0;
  dStack_548 = 0.0;
  pSVar8 = (local_590->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  aStack_560._8_8_ = p_Var3;
  local_550 = p_Var3;
  (*pSVar8->_vptr_Statement[4])(pSVar8,local_570);
  if ((_Rb_tree_node_base *)aStack_560._8_8_ != p_Var3) {
    uVar22 = aStack_560._8_8_;
    do {
      (**(code **)(**(long **)(uVar22 + 0x20) + 0x30))(*(long **)(uVar22 + 0x20),local_1a8);
      uVar22 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar22);
    } while ((_Rb_tree_node_base *)uVar22 != p_Var3);
  }
  if (dStack_548 != 0.0) {
    poVar4 = (ostringstream *)(local_4a8 + 8);
    local_4a8._0_8_ = local_588;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,(char *)local_4d8.m_data[0]._0_8_,(long)local_4d8.m_data[0].m_lo);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((double *)local_4d8.m_data[0]._0_8_ != &local_4d8.m_data[0].m_hi) {
      operator_delete((void *)local_4d8.m_data[0]._0_8_,(long)local_4d8.m_data[0].m_hi + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_430);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_570);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)local_138);
  pSVar9 = (local_590->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar9->_vptr_ShaderExecutor[2])(pSVar9,local_578,&local_218,&local_288,0);
  lVar23 = 8;
  do {
    local_1a8[lVar23 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar23) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar23 + 8) = 0xfff0000000000000;
    lVar23 = lVar23 + 0x18;
  } while (lVar23 != 0x68);
  lVar23 = 8;
  do {
    local_1a8[lVar23 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar23) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar23 + 8) = 0xfff0000000000000;
    lVar23 = lVar23 + 0x18;
  } while (lVar23 != 0x68);
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_4a8);
  pBVar32 = local_590;
  local_570._0_8_ = local_570._0_8_ & 0xffffffffffffff00;
  stack0xfffffffffffffa98 = INFINITY;
  aStack_560._M_allocated_capacity = 0xfff0000000000000;
  aStack_560._8_8_ = aStack_560._8_8_ & 0xffffffffffffff00;
  local_550 = (_Base_ptr)0x7ff0000000000000;
  dStack_548 = -INFINITY;
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2b8,
             (local_590->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_1a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2b8,
             (pBVar32->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4d8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2b8,
             (pBVar32->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&stack0xfffffffffffffa48);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2b8,
             (pBVar32->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_510);
  Environment::bind<tcu::Matrix<float,4,2>>
            ((Environment *)&local_2b8,
             (pBVar32->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>.m_ptr,
             (IVal *)local_4a8);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_2b8,
             (pBVar32->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_570);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar17) {
LAB_009563fc:
    poVar4 = (ostringstream *)(local_4a8 + 8);
    local_4a8._0_8_ = local_588;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"All ",4);
    pTVar34 = local_4e8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_430);
    local_4a8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_4a8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"Pass","");
    pTVar34->m_code = QP_TEST_RESULT_PASS;
    (pTVar34->m_description)._M_dataplus._M_p = (pointer)&(pTVar34->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar34->m_description,local_4a8._0_8_,
               (char *)(local_4a8._0_8_ + CONCAT44(local_4a8._12_4_,local_4a8._8_4_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_4a8 + 0x10)) goto LAB_009565e3;
    uVar22 = (_Base_ptr)
             CONCAT44(local_498._M_allocated_capacity._4_4_,local_498._M_allocated_capacity._0_4_);
    paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._0_8_;
  }
  else {
    local_300 = local_578 + (local_578 == 0);
    local_580 = 0;
    local_4f0 = 0;
    pBVar32 = local_590;
    do {
      tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_1a8);
      lVar15 = local_580;
      local_4d8.m_data[0]._0_8_ = local_4d8.m_data[0]._0_8_ & 0xffffffffffffff00;
      local_4d8.m_data[0].m_lo = INFINITY;
      local_4d8.m_data[0].m_hi = -INFINITY;
      local_4d8.m_data[1]._0_8_ = local_4d8.m_data[1]._0_8_ & 0xffffffffffffff00;
      local_4d8.m_data[1].m_lo = INFINITY;
      local_4d8.m_data[1].m_hi = -INFINITY;
      _Var36._M_p = *(pointer *)
                     local_278.in0.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_580].m_data;
      lVar23 = *(long *)(local_278.in0.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_580].m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_570,pFVar33,(Vector<float,_4> *)&stack0xfffffffffffffa48);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_4a8,pFVar33,(IVal *)local_570);
      pIVar24 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2b8,
                           (pBVar32->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      psVar29 = (string *)local_4a8;
      for (lVar27 = 0xc; lVar27 != 0; lVar27 = lVar27 + -1) {
        *(pointer *)pIVar24->m_data = (psVar29->_M_dataplus)._M_p;
        psVar29 = (string *)((long)psVar29 + (ulong)bVar35 * -0x10 + 8);
        pIVar24 = (IVal *)((long)pIVar24 + ((ulong)bVar35 * -2 + 1) * 8);
      }
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_2b8,
                 (pBVar32->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_2b8,
                 (pBVar32->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_2b8,
                 (pBVar32->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      PStack_480 = (pBVar32->m_caseCtx).precision;
      local_488 = pFVar33->m_maxValue;
      local_4a8._0_8_ = *(undefined8 *)pFVar33;
      local_4a8._8_4_ = pFVar33->m_fractionBits;
      local_4a8._12_4_ = pFVar33->m_hasSubnormal;
      local_498._M_allocated_capacity._0_4_ = pFVar33->m_hasInf;
      local_498._M_allocated_capacity._4_4_ = pFVar33->m_hasNaN;
      local_498._8_1_ = pFVar33->m_exactPrecision;
      local_498._9_3_ = *(undefined3 *)&pFVar33->field_0x19;
      local_498._12_4_ = *(undefined4 *)&pFVar33->field_0x1c;
      local_470 = 0;
      pSVar8 = (pBVar32->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_478 = &local_2b8;
      (*pSVar8->_vptr_Statement[3])(pSVar8,(string *)local_4a8);
      value = Environment::lookup<tcu::Vector<float,2>>
                        ((Environment *)&local_2b8,
                         (pBVar32->m_variables).out1.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                         .m_ptr);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_4a8,&local_328,value);
      local_4d8.m_data[0].m_lo = (double)CONCAT44(local_4a8._12_4_,local_4a8._8_4_);
      local_4d8.m_data[0].m_hi =
           (double)CONCAT44(local_498._M_allocated_capacity._4_4_,
                            local_498._M_allocated_capacity._0_4_);
      local_4d8.m_data[1]._0_8_ = CONCAT44(local_498._12_4_,local_498._8_4_);
      local_4d8.m_data[1].m_hi = (double)CONCAT44(uStack_47c,PStack_480);
      local_4d8.m_data[1].m_lo = local_488;
      local_4d8.m_data[0]._0_8_ = local_4a8._0_8_;
      local_2f0 = local_580 * 8;
      bVar18 = contains<tcu::Vector<float,2>>
                         (&local_4d8,
                          local_2e8.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_580);
      local_4a8._0_8_ = local_4a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4a8,"Shader output 1 is outside acceptable range","");
      bVar18 = tcu::ResultCollector::check(&local_1f8,bVar18,(string *)local_4a8);
      if ((TestLog *)local_4a8._0_8_ != (TestLog *)(local_4a8 + 0x10)) {
        operator_delete((void *)local_4a8._0_8_,
                        CONCAT44(local_498._M_allocated_capacity._4_4_,
                                 local_498._M_allocated_capacity._0_4_) + 1);
      }
      value_00 = Environment::lookup<tcu::Matrix<float,4,2>>
                           ((Environment *)&local_2b8,
                            (pBVar32->m_variables).out0.
                            super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>
                            .m_ptr);
      ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doConvert
                ((IVal *)local_4a8,&local_328,value_00);
      pMVar16 = local_2e8.out0.
                super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar27 = local_580;
      lVar25 = 0;
      do {
        *(undefined8 *)(local_1a8 + lVar25 + 0x10) = *(undefined8 *)(local_4a8 + lVar25 + 0x10);
        uVar22 = *(undefined8 *)(local_4a8 + lVar25 + 8);
        *(undefined8 *)(local_1a8 + lVar25) = *(undefined8 *)(local_4a8 + lVar25);
        *(undefined8 *)(local_1a8 + lVar25 + 8) = uVar22;
        uVar22 = *(undefined8 *)((long)auStack_448 + lVar25 + 8);
        *(undefined8 *)(local_1a8 + lVar25 + 0x60) = *(undefined8 *)((long)auStack_448 + lVar25);
        *(undefined8 *)(local_1a8 + lVar25 + 0x68) = uVar22;
        *(undefined8 *)((long)local_138 + lVar25) = *(undefined8 *)(local_438 + lVar25);
        lVar25 = lVar25 + 0x18;
      } while (lVar25 != 0x60);
      local_2f8 = local_580 * 0x20;
      bVar31 = 1;
      lVar25 = 0;
      pIVar24 = (IVal *)local_1a8;
      do {
        bVar19 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                           (pIVar24,pMVar16[lVar27].m_data.m_data + lVar25);
        lVar25 = 1;
        bVar14 = bVar31 & bVar19;
        bVar31 = 0;
        pIVar24 = (IVal *)(local_1a8 + 0x60);
      } while (bVar14 != 0);
      local_4a8._0_8_ = local_4a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4a8,"Shader output 0 is outside acceptable range","");
      bVar19 = tcu::ResultCollector::check(&local_1f8,bVar19,(string *)local_4a8);
      pFVar33 = local_4e0;
      pBVar32 = local_590;
      if ((TestLog *)local_4a8._0_8_ != (TestLog *)(local_4a8 + 0x10)) {
        operator_delete((void *)local_4a8._0_8_,
                        CONCAT44(local_498._M_allocated_capacity._4_4_,
                                 local_498._M_allocated_capacity._0_4_) + 1);
      }
      if ((!bVar18 || !bVar19) &&
         (uVar21 = (int)local_4f0 + 1, local_4f0 = (ulong)uVar21, (int)uVar21 < 0x65)) {
        local_4a8._0_8_ = local_588;
        poVar4 = (ostringstream *)(local_4a8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar10 = (pBVar32->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                  m_ptr;
        paVar28 = &aStack_560;
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_570._0_8_ = paVar28;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_570,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4a8 + 8),(char *)local_570._0_8_,(long)stack0xfffffffffffffa98)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8)," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)&stack0xfffffffffffffa48,(shaderexecutor *)&local_328,
                   (FloatFormat *)
                   (local_278.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar15),(Vector<float,_4> *)paVar28)
        ;
        poVar5 = (ostream *)(local_4a8 + 8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,_Var36._M_p,lVar23);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var36._M_p != &local_5a8) {
          operator_delete(_Var36._M_p,local_5a8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570._0_8_ != &aStack_560) {
          operator_delete((void *)local_570._0_8_,(ulong)(aStack_560._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
        pVVar12 = (pBVar32->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>.
                  m_ptr;
        paVar28 = &aStack_560;
        pcVar11 = (pVVar12->m_name)._M_dataplus._M_p;
        local_570._0_8_ = paVar28;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_570,pcVar11,pcVar11 + (pVVar12->m_name)._M_string_length);
        poVar5 = (ostream *)(local_4a8 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,(char *)local_570._0_8_,(long)stack0xfffffffffffffa98);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
        valueToString<tcu::Matrix<float,4,2>>
                  ((string *)&stack0xfffffffffffffa48,(shaderexecutor *)&local_328,
                   (FloatFormat *)
                   ((long)((local_2e8.out0.
                            super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   local_2f8),(Matrix<float,_4,_2> *)paVar28);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,_Var36._M_p,lVar23);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,4,2>>
                  (&local_510,(shaderexecutor *)&local_328,(FloatFormat *)local_1a8,(IVal *)paVar28)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_510._M_dataplus._M_p,local_510._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != &local_510.field_2) {
          operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var36._M_p != &local_5a8) {
          operator_delete(_Var36._M_p,local_5a8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570._0_8_ != &aStack_560) {
          operator_delete((void *)local_570._0_8_,(ulong)(aStack_560._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
        pVVar13 = (pBVar32->m_variables).out1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                  m_ptr;
        paVar28 = &aStack_560;
        pcVar11 = (pVVar13->m_name)._M_dataplus._M_p;
        local_570._0_8_ = paVar28;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_570,pcVar11,pcVar11 + (pVVar13->m_name)._M_string_length);
        poVar5 = (ostream *)(local_4a8 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,(char *)local_570._0_8_,(long)stack0xfffffffffffffa98);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
        valueToString<tcu::Vector<float,2>>
                  ((string *)&stack0xfffffffffffffa48,(shaderexecutor *)&local_328,
                   (FloatFormat *)
                   ((long)(local_2e8.out1.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_2f0),
                   (Vector<float,_2> *)&paVar28->_M_allocated_capacity);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,_Var36._M_p,lVar23);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,2>>
                  (&local_510,(shaderexecutor *)&local_328,(FloatFormat *)&local_4d8,(IVal *)paVar28
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_510._M_dataplus._M_p,local_510._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != &local_510.field_2) {
          operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var36._M_p != &local_5a8) {
          operator_delete(_Var36._M_p,local_5a8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570._0_8_ != &aStack_560) {
          operator_delete((void *)local_570._0_8_,(ulong)(aStack_560._M_allocated_capacity + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_4a8 + 8));
        std::ios_base::~ios_base(local_430);
      }
      local_580 = local_580 + 1;
    } while (local_580 != local_300);
    iVar20 = (int)local_4f0;
    if (iVar20 < 0x65) {
      if (iVar20 == 0) goto LAB_009563fc;
    }
    else {
      poVar4 = (ostringstream *)(local_4a8 + 8);
      local_4a8._0_8_ = local_588;
      std::__cxx11::ostringstream::ostringstream(poVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"(Skipped ",9);
      std::ostream::operator<<(poVar4,iVar20 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar4);
      std::ios_base::~ios_base(local_430);
    }
    poVar4 = (ostringstream *)(local_4a8 + 8);
    local_4a8._0_8_ = local_588;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::ostream::operator<<(poVar4,iVar20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_430);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
    std::ostream::operator<<(local_4a8,iVar20);
    pTVar34 = local_4e8;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
    std::ios_base::~ios_base(local_438);
    local_4a8._0_8_ = local_4a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4a8," test failed. Check log for the details","");
    p_Var2 = (_Base_ptr)(CONCAT44(local_4a8._12_4_,local_4a8._8_4_) + (long)stack0xfffffffffffffa98)
    ;
    uVar22 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570._0_8_ != &aStack_560) {
      uVar22 = aStack_560._M_allocated_capacity;
    }
    if ((ulong)uVar22 < p_Var2) {
      p_Var30 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_4a8 + 0x10)) {
        p_Var30 = (_Base_ptr)
                  CONCAT44(local_498._M_allocated_capacity._4_4_,
                           local_498._M_allocated_capacity._0_4_);
      }
      if (p_Var30 < p_Var2) goto LAB_009563ed;
      puVar26 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_4a8,0,(char *)0x0,local_570._0_8_);
    }
    else {
LAB_009563ed:
      puVar26 = (undefined8 *)std::__cxx11::string::_M_append(local_570,local_4a8._0_8_);
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    pdVar1 = (double *)(puVar26 + 2);
    if ((double *)*puVar26 == pdVar1) {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._24_4_ = *(undefined4 *)(puVar26 + 3);
      local_1a8._28_4_ = *(undefined4 *)((long)puVar26 + 0x1c);
    }
    else {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._0_8_ = (double *)*puVar26;
    }
    local_1a8._8_8_ = puVar26[1];
    *puVar26 = pdVar1;
    puVar26[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar34->m_code = QP_TEST_RESULT_FAIL;
    (pTVar34->m_description)._M_dataplus._M_p = (pointer)&(pTVar34->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar34->m_description,local_1a8._0_8_,
               (undefined1 *)(local_1a8._8_8_ + local_1a8._0_8_));
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_4a8 + 0x10)) {
      operator_delete((void *)local_4a8._0_8_,
                      CONCAT44(local_498._M_allocated_capacity._4_4_,
                               local_498._M_allocated_capacity._0_4_) + 1);
    }
    uVar22 = aStack_560._M_allocated_capacity;
    paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_570._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570._0_8_ == &aStack_560) goto LAB_009565e3;
  }
  operator_delete(paVar28,(ulong)((long)&((_Base_ptr)uVar22)->_M_color + 1));
LAB_009565e3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2b8);
  if (local_2e8.out1.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out1.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8.out0.
      super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar34;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}